

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManComputeTruthPtr(If_DsdMan_t *p,int iDsd,uchar *pPermLits,word *pRes)

{
  word **ppwVar1;
  word *pIn;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong in_RAX;
  void *pvVar6;
  int nSupp;
  int local_34;
  
  _nSupp = in_RAX & 0xffffffff00000000;
  iVar2 = Abc_Lit2Var(iDsd);
  pvVar6 = Vec_PtrEntry(&p->vObjs,iVar2);
  if (iDsd == 1) {
    Abc_TtConst1(pRes,p->nWords);
  }
  else {
    if (iDsd != 0) {
      if ((*(uint *)((long)pvVar6 + 4) & 7) == 2) {
        if (pPermLits == (uchar *)0x0) {
          uVar5 = Abc_Var2Lit(0,0);
        }
        else {
          uVar5 = (uint)*pPermLits;
        }
        _nSupp = CONCAT44(local_34,1);
        ppwVar1 = p->pTtElems;
        uVar4 = Abc_Lit2Var(uVar5);
        pIn = ppwVar1[uVar4];
        _nSupp = CONCAT44(p->nWords,nSupp);
        uVar4 = Abc_LitIsCompl(iDsd);
        uVar5 = Abc_LitIsCompl(uVar5);
        Abc_TtCopy(pRes,pIn,local_34,uVar4 ^ uVar5);
        iVar2 = 1;
      }
      else {
        If_DsdManComputeTruth_rec(p,iDsd,pRes,pPermLits,&nSupp);
        iVar2 = nSupp;
      }
      goto LAB_00384864;
    }
    Abc_TtConst0(pRes,p->nWords);
  }
  iVar2 = 0;
LAB_00384864:
  iVar3 = If_DsdVecLitSuppSize(&p->vObjs,iDsd);
  if (iVar2 == iVar3) {
    return;
  }
  __assert_fail("nSupp == If_DsdVecLitSuppSize(&p->vObjs, iDsd)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x591,"void If_DsdManComputeTruthPtr(If_DsdMan_t *, int, unsigned char *, word *)")
  ;
}

Assistant:

void If_DsdManComputeTruthPtr( If_DsdMan_t * p, int iDsd, unsigned char * pPermLits, word * pRes )
{
    int nSupp = 0;
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Abc_Lit2Var(iDsd) );
    if ( iDsd == 0 )
        Abc_TtConst0( pRes, p->nWords );
    else if ( iDsd == 1 )
        Abc_TtConst1( pRes, p->nWords );
    else if ( pObj->Type == IF_DSD_VAR )
    {
        int iPermLit = pPermLits ? (int)pPermLits[nSupp] : Abc_Var2Lit(nSupp, 0);
        nSupp++;
        Abc_TtCopy( pRes, p->pTtElems[Abc_Lit2Var(iPermLit)], p->nWords, Abc_LitIsCompl(iDsd) ^ Abc_LitIsCompl(iPermLit) );
    }
    else
        If_DsdManComputeTruth_rec( p, iDsd, pRes, pPermLits, &nSupp );
    assert( nSupp == If_DsdVecLitSuppSize(&p->vObjs, iDsd) );
}